

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

double __thiscall RandomGen::FindNewMean(RandomGen *this,double sigma)

{
  double dVar1;
  double dVar2;
  return_t<double> rVar3;
  double BigPhi_Alpha;
  double LittlePhi_Alpha;
  double TruncGaussAlpha;
  double sigma_local;
  RandomGen *this_local;
  
  dVar1 = -1.0 / sigma;
  dVar2 = exp(dVar1 * -0.5 * dVar1);
  rVar3 = gcem::sqrt<double>(6.283185307179586);
  dVar1 = erf(dVar1 / 1.414213562373095);
  return ((dVar2 / rVar3) / (1.0 - (dVar1 + 1.0) * 0.5)) * sigma + 1.0;
}

Assistant:

double RandomGen::FindNewMean(double sigma) {
  // Follow https://en.wikipedia.org/wiki/Truncated_normal_distribution
  double TruncGaussAlpha = -1. / sigma;
  double LittlePhi_Alpha =
      exp(-0.5 * TruncGaussAlpha * TruncGaussAlpha) / gcem::sqrt(2. * M_PI);
  double BigPhi_Alpha = 0.5 * (1. + erf(TruncGaussAlpha / sqrt2));
  return 1. + (LittlePhi_Alpha / (1. - BigPhi_Alpha)) * sigma;
}